

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_4> * __thiscall
tcu::normalize<double,4>(Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *a)

{
  int i;
  long lVar1;
  Type TVar2;
  
  TVar2 = length<double,4>((Vector<double,_4> *)this);
  Vector<double,_4>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    __return_storage_ptr__->m_data[lVar1] = *(double *)(this + lVar1 * 8) * (1.0 / TVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}